

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitStringConcat
          (WasmBinaryBuilder *this,Expression **out,uint32_t code)

{
  StringConcat *pSVar1;
  Builder local_40;
  Expression *local_38;
  Expression *left;
  Expression *right;
  Expression **ppEStack_20;
  uint32_t code_local;
  Expression **out_local;
  WasmBinaryBuilder *this_local;
  
  if (code == 0x88) {
    right._4_4_ = code;
    ppEStack_20 = out;
    out_local = (Expression **)this;
    left = popNonVoidExpression(this);
    local_38 = popNonVoidExpression(this);
    Builder::Builder(&local_40,this->wasm);
    pSVar1 = Builder::makeStringConcat(&local_40,local_38,left);
    *ppEStack_20 = (Expression *)pSVar1;
  }
  return code == 0x88;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitStringConcat(Expression*& out,
                                               uint32_t code) {
  if (code != BinaryConsts::StringConcat) {
    return false;
  }
  auto* right = popNonVoidExpression();
  auto* left = popNonVoidExpression();
  out = Builder(wasm).makeStringConcat(left, right);
  return true;
}